

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-error.c
# Opt level: O1

int run_test_sys_error(void)

{
  int iVar1;
  
  iVar1 = uv_translate_sys_error(1);
  if (iVar1 == -1) {
    iVar1 = uv_translate_sys_error(0x20);
    if (iVar1 != -0x20) goto LAB_00154e2f;
    iVar1 = uv_translate_sys_error(0x16);
    if (iVar1 != -0x16) goto LAB_00154e34;
    iVar1 = uv_translate_sys_error(-0x16);
    if (iVar1 != -0x16) goto LAB_00154e39;
    iVar1 = uv_translate_sys_error(-0x22);
    if (iVar1 != -0x22) goto LAB_00154e3e;
    iVar1 = uv_translate_sys_error(-0xd);
    if (iVar1 == -0xd) {
      iVar1 = uv_translate_sys_error(0);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00154e48;
    }
  }
  else {
    run_test_sys_error_cold_1();
LAB_00154e2f:
    run_test_sys_error_cold_2();
LAB_00154e34:
    run_test_sys_error_cold_3();
LAB_00154e39:
    run_test_sys_error_cold_4();
LAB_00154e3e:
    run_test_sys_error_cold_5();
  }
  run_test_sys_error_cold_6();
LAB_00154e48:
  run_test_sys_error_cold_7();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fail-always.c"
          ,0x1b,"Yes, it always fails");
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(sys_error) {
#if defined(_WIN32)
  ASSERT(uv_translate_sys_error(ERROR_NOACCESS) == UV_EACCES);
  ASSERT(uv_translate_sys_error(ERROR_ELEVATION_REQUIRED) == UV_EACCES);
  ASSERT(uv_translate_sys_error(WSAEADDRINUSE) == UV_EADDRINUSE);
  ASSERT(uv_translate_sys_error(ERROR_BAD_PIPE) == UV_EPIPE);
#else
  ASSERT(uv_translate_sys_error(EPERM) == UV_EPERM);
  ASSERT(uv_translate_sys_error(EPIPE) == UV_EPIPE);
  ASSERT(uv_translate_sys_error(EINVAL) == UV_EINVAL);
#endif
  ASSERT(uv_translate_sys_error(UV_EINVAL) == UV_EINVAL);
  ASSERT(uv_translate_sys_error(UV_ERANGE) == UV_ERANGE);
  ASSERT(uv_translate_sys_error(UV_EACCES) == UV_EACCES);
  ASSERT(uv_translate_sys_error(0) == 0);

  return 0;
}